

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# importer.cc
# Opt level: O0

bool google::protobuf::compiler::ContainsParentReference(string *path)

{
  bool bVar1;
  bool bVar2;
  string *psVar3;
  bool bVar4;
  long lVar5;
  bool local_74;
  allocator local_71;
  string local_70;
  byte local_4d;
  byte local_3a;
  allocator local_39;
  string local_38;
  string *local_18;
  string *path_local;
  
  local_18 = path;
  bVar4 = std::operator==(path,"..");
  psVar3 = local_18;
  local_3a = 0;
  local_4d = 0;
  bVar2 = false;
  bVar1 = false;
  local_74 = true;
  if (!bVar4) {
    std::allocator<char>::allocator();
    local_3a = 1;
    std::__cxx11::string::string((string *)&local_38,"../",&local_39);
    local_4d = 1;
    bVar4 = HasPrefixString(psVar3,&local_38);
    psVar3 = local_18;
    local_74 = true;
    if (!bVar4) {
      std::allocator<char>::allocator();
      bVar2 = true;
      std::__cxx11::string::string((string *)&local_70,"/..",&local_71);
      bVar1 = true;
      bVar4 = HasSuffixString(psVar3,&local_70);
      local_74 = true;
      if (!bVar4) {
        lVar5 = std::__cxx11::string::find((char *)local_18,0x626947);
        local_74 = lVar5 != -1;
      }
    }
  }
  path_local._7_1_ = local_74;
  if (bVar1) {
    std::__cxx11::string::~string((string *)&local_70);
  }
  if (bVar2) {
    std::allocator<char>::~allocator((allocator<char> *)&local_71);
  }
  if ((local_4d & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_38);
  }
  if ((local_3a & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_39);
  }
  return (bool)(path_local._7_1_ & 1);
}

Assistant:

static inline bool ContainsParentReference(const string& path) {
  return path == ".." ||
         HasPrefixString(path, "../") ||
         HasSuffixString(path, "/..") ||
         path.find("/../") != string::npos;
}